

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

SimpleString __thiscall
TestFailure::createDifferenceAtPosString
          (TestFailure *this,SimpleString *actual,size_t position,DifferenceFormat format)

{
  SimpleString *this_00;
  char *pcVar1;
  size_t repeatCount;
  SimpleString *pSVar2;
  SimpleString *in_RCX;
  size_t extraout_RDX;
  SimpleString *in_RDI;
  int in_R8D;
  SimpleString SVar3;
  SimpleString markString;
  SimpleString differentString;
  SimpleString actualString;
  SimpleString paddingForPreventingOutOfBounds;
  size_t actualOffset;
  size_t halfOfExtraCharactersWindow;
  size_t extraCharactersWindow;
  SimpleString *result;
  SimpleString *in_stack_fffffffffffffeb8;
  SimpleString *in_stack_fffffffffffffec0;
  size_t in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  SimpleString *in_stack_fffffffffffffee0;
  int markerPos;
  SimpleString *str;
  char local_f0 [80];
  char local_a0 [16];
  char local_90 [72];
  
  str = in_RDI;
  SimpleString::SimpleString(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
  markerPos = (int)((ulong)in_RDI >> 0x20);
  pSVar2 = in_RCX;
  if (in_R8D != 0) {
    pSVar2 = (SimpleString *)((long)in_RCX * 3 + 1);
  }
  SimpleString::SimpleString
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  SimpleString::operator+(pSVar2,in_stack_fffffffffffffee0);
  SimpleString::operator+(pSVar2,in_stack_fffffffffffffee0);
  SimpleString::~SimpleString((SimpleString *)0x179156);
  StringFromFormat(local_90,"difference starts at position %lu at: <",in_RCX);
  SimpleString::operator+=(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  this_00 = (SimpleString *)SimpleString::asCharString((SimpleString *)0x179196);
  SimpleString::subString(pSVar2,(size_t)this_00,(size_t)in_stack_fffffffffffffed8);
  pcVar1 = SimpleString::asCharString((SimpleString *)0x1791ce);
  StringFromFormat(local_a0,"\t%s%s>\n",this_00,pcVar1);
  SimpleString::operator+=(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  SimpleString::~SimpleString((SimpleString *)0x179218);
  SimpleString::~SimpleString((SimpleString *)0x179225);
  SimpleString::subString(pSVar2,(size_t)this_00,(size_t)pcVar1);
  removeAllPrintableCharactersFrom(str);
  SimpleString::operator=(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  SimpleString::~SimpleString((SimpleString *)0x17927b);
  addMarkerToString(str,markerPos);
  SimpleString::operator=(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  SimpleString::~SimpleString((SimpleString *)0x1792b2);
  repeatCount = SimpleString::size((SimpleString *)0x1792bf);
  SimpleString::SimpleString(this_00,pcVar1,repeatCount);
  pcVar1 = SimpleString::asCharString((SimpleString *)0x1792e8);
  pSVar2 = (SimpleString *)SimpleString::asCharString((SimpleString *)0x1792fc);
  StringFromFormat(local_f0,"\t%s%s",pcVar1,pSVar2);
  SimpleString::operator+=(pSVar2,in_stack_fffffffffffffeb8);
  SimpleString::~SimpleString((SimpleString *)0x17933d);
  SimpleString::~SimpleString((SimpleString *)0x179347);
  SimpleString::~SimpleString((SimpleString *)0x17935c);
  SimpleString::~SimpleString((SimpleString *)0x179369);
  SimpleString::~SimpleString((SimpleString *)0x179376);
  SimpleString::~SimpleString((SimpleString *)0x179383);
  SVar3.bufferSize_ = extraout_RDX;
  SVar3.buffer_ = (char *)str;
  return SVar3;
}

Assistant:

SimpleString TestFailure::createDifferenceAtPosString(const SimpleString& actual, size_t position, DifferenceFormat format)
{
    SimpleString result;
    const size_t extraCharactersWindow = 20;
    const size_t halfOfExtraCharactersWindow = extraCharactersWindow / 2;
    const size_t actualOffset = (format == DIFFERENCE_STRING) ? position : (position * 3 + 1);

    SimpleString paddingForPreventingOutOfBounds (" ", halfOfExtraCharactersWindow);
    SimpleString actualString = paddingForPreventingOutOfBounds + actual + paddingForPreventingOutOfBounds;
    SimpleString differentString = StringFromFormat("difference starts at position %lu at: <", (unsigned long) position);

    result += "\n";
    result += StringFromFormat("\t%s%s>\n", differentString.asCharString(), actualString.subString(actualOffset, extraCharactersWindow).asCharString());

    SimpleString markString = actualString.subString(actualOffset, halfOfExtraCharactersWindow+1);
    markString = removeAllPrintableCharactersFrom(markString);
    markString = addMarkerToString(markString, halfOfExtraCharactersWindow);

    result += StringFromFormat("\t%s%s", SimpleString(" ", differentString.size()).asCharString(), markString.asCharString());
    return result;
}